

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O3

void insert<16384u,vector_brodnik<unsigned_char*>,BurstSimple<unsigned_char>,unsigned_char>
               (TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *root,uchar **strings,
               size_t n)

{
  byte *pbVar1;
  uchar **ppuVar2;
  pointer ppvVar3;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *this;
  vector_brodnik<unsigned_char_*> *this_00;
  size_t sVar4;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *pTVar5;
  byte bVar6;
  size_t depth;
  long lVar7;
  uint index;
  size_t sVar9;
  BurstSimple<unsigned_char> local_49;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *local_48;
  size_t local_40;
  uchar **local_38;
  ulong uVar8;
  
  if (n != 0) {
    sVar9 = 0;
    local_48 = root;
    local_40 = n;
    local_38 = strings;
    do {
      pbVar1 = local_38[sVar9];
      if (pbVar1 == (byte *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      bVar6 = *pbVar1;
      uVar8 = (ulong)bVar6;
      index = (uint)bVar6;
      ppvVar3 = (local_48->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      depth = 1;
      this = local_48;
      if (uVar8 < (ulong)((long)(local_48->_buckets).
                                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)ppvVar3 >> 3)) {
        lVar7 = 0;
        do {
          if (((ulong)ppvVar3[uVar8] & 1) == 0) break;
          if (bVar6 == 0) {
            __assert_fail("not is_end(c)",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                          ,0xeb,
                          "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = vector_brodnik<unsigned char *>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                         );
          }
          this = TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::get_node
                           (this,(uint)uVar8);
          bVar6 = pbVar1[lVar7 + 1];
          lVar7 = lVar7 + 1;
          uVar8 = (ulong)bVar6;
          ppvVar3 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar8 < (ulong)((long)(this->_buckets).
                                       super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)ppvVar3 >> 3));
        index = (uint)uVar8;
        depth = lVar7 + 1;
      }
      this_00 = TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::get_bucket(this,index);
      if (this_00 == (vector_brodnik<unsigned_char_*> *)0x0) {
        __assert_fail("bucket",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0xf1,
                      "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = vector_brodnik<unsigned char *>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                     );
      }
      sVar4 = this_00->_left_in_block;
      if (sVar4 == 0) {
        vector_brodnik<unsigned_char_*>::grow(this_00);
        sVar4 = this_00->_left_in_block;
      }
      ppuVar2 = this_00->_insertpos;
      this_00->_insertpos = ppuVar2 + 1;
      *ppuVar2 = pbVar1;
      this_00->_left_in_block = sVar4 - 1;
      if ((bVar6 != 0) &&
         (0x4000 < ((long)(2 << (this_00->_superblock & 0x1f)) -
                   (sVar4 + (ulong)this_00->_left_in_superblock * this_00->_block_size)) - 0x3f)) {
        pTVar5 = BurstSimple<unsigned_char>::operator()(&local_49,this_00,depth);
        *(TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> **)
         ((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start + (ulong)((uint)bVar6 * 8)) = pTVar5;
        ppvVar3 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar8 = *(ulong *)((long)ppvVar3 + (ulong)((uint)bVar6 * 8));
        if (uVar8 == 0) {
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0x5c,"void make_trie(void *&)");
        }
        ppvVar3[bVar6] = (void *)(uVar8 | 1);
        vector_brodnik<unsigned_char_*>::~vector_brodnik(this_00);
        operator_delete(this_00);
      }
      sVar9 = sVar9 + 1;
    } while (sVar9 != local_40);
  }
  return;
}

Assistant:

static inline void
insert(TrieNode<CharT, BucketT>* root, unsigned char** strings, size_t n)
{
	for (size_t i=0; i < n; ++i) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		CharT c = get_char<CharT>(str, 0);
		TrieNode<CharT, BucketT>* node = root;
		while (node->is_trie(c)) {
			assert(not is_end(c));
			node = node->get_node(c);
			depth += sizeof(CharT);
			c = get_char<CharT>(str, depth);
		}
		BucketT* bucket = node->get_bucket(c);
		assert(bucket);
		bucket->push_back(str);
		if (is_end(c)) continue;
		if (bucket->size() > Threshold) {
			node->_buckets[c] = BurstImpl()(*bucket,
					depth+sizeof(CharT));
			make_trie(node->_buckets[c]);
			delete bucket;
		}
	}
}